

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int get_lvalue(JSParseState *s,int *popcode,int *pscope,JSAtom *pname,int *plabel,int *pdepth,
              BOOL keep,int tok)

{
  byte bVar1;
  ushort uVar2;
  JSFunctionDef *fd;
  uint8_t *puVar3;
  undefined2 uVar4;
  int iVar5;
  size_t sVar6;
  uint8_t val;
  char *fmt;
  int iVar7;
  uint uVar8;
  uint uVar9;
  JSAtom name;
  undefined2 local_5e;
  undefined2 local_5c;
  undefined2 local_5a;
  uint *local_58;
  uint *local_50;
  JSAtom *local_48;
  int *local_40;
  int local_38;
  int local_34;
  
  fd = s->cur_func;
  sVar6 = (size_t)fd->last_opcode_pos;
  if ((long)sVar6 < 0) goto LAB_00156975;
  puVar3 = (fd->byte_code).buf;
  bVar1 = puVar3[sVar6];
  uVar9 = (uint)bVar1;
  iVar7 = 2;
  if (bVar1 < 0x4a) {
    if (bVar1 == 0x41) {
      name = *(JSAtom *)(puVar3 + sVar6 + 1);
      iVar7 = 1;
      uVar8 = 0;
    }
    else {
      uVar8 = 0;
      name = 0;
      if (bVar1 != 0x47) goto LAB_00156975;
    }
  }
  else if (bVar1 == 0x4a) {
    uVar8 = 0;
    iVar7 = 3;
    name = 0;
  }
  else if (bVar1 == 0xbc) {
    name = *(JSAtom *)(puVar3 + sVar6 + 1);
    uVar8 = (uint)*(ushort *)(puVar3 + sVar6 + 5);
    iVar7 = 1;
  }
  else {
    if (bVar1 != 0xb6) {
LAB_00156975:
      if (tok == -0x45) {
        fmt = "invalid for in/of left hand-side";
      }
      else if ((tok & 0xfffffffeU) == 0xffffff94) {
        fmt = "invalid increment/decrement operand";
      }
      else if ((tok & 0xffffffdfU) == 0x5b) {
        fmt = "invalid destructuring target";
      }
      else {
        fmt = "invalid assignment left-hand side";
      }
LAB_001569b2:
      js_parse_error(s,fmt);
      return -1;
    }
    name = *(JSAtom *)(puVar3 + sVar6 + 1);
    uVar2 = *(ushort *)(puVar3 + sVar6 + 5);
    uVar8 = (uint)uVar2;
    if ((int)name < 0x4d) {
      if (name == 8) goto LAB_00156975;
      if (name == 0x3a) {
LAB_0015695e:
        uVar8 = (uint)uVar2;
        if ((fd->js_mode & 1) != 0) {
          fmt = "invalid lvalue in strict mode";
          goto LAB_001569b2;
        }
      }
    }
    else {
      if (name == 0x71) goto LAB_00156975;
      uVar8 = (uint)uVar2;
      if (name == 0x4d) goto LAB_0015695e;
    }
  }
  (fd->byte_code).size = sVar6;
  fd->last_opcode_pos = -1;
  uVar4 = (undefined2)uVar8;
  local_58 = (uint *)popcode;
  local_50 = (uint *)pscope;
  local_48 = pname;
  local_40 = plabel;
  if (keep == 0) {
    iVar5 = -1;
    if (bVar1 == 0x47) {
      emit_op(s,'q');
      uVar9 = 0x47;
    }
    else if (bVar1 == 0x4a) {
      emit_op(s,'p');
      uVar9 = 0x4a;
    }
    else if (bVar1 == 0xb6) {
      iVar5 = new_label_fd(fd,-1);
      emit_op(s,0xb9);
      emit_atom(s,name);
      local_34 = iVar5;
      dbuf_put(&s->cur_func->byte_code,(uint8_t *)&local_34,4);
      local_5a = uVar4;
      dbuf_put(&s->cur_func->byte_code,(uint8_t *)&local_5a,2);
      fd->label_slots[iVar5].ref_count = fd->label_slots[iVar5].ref_count + 1;
      uVar9 = 0x3c;
    }
  }
  else {
    if (bVar1 < 0x4a) {
      if (bVar1 == 0x41) {
        emit_op(s,'B');
        emit_atom(s,name);
        iVar5 = -1;
        uVar9 = 0x41;
        goto LAB_001569eb;
      }
      if (bVar1 != 0x47) {
LAB_00156a2a:
        abort();
      }
      emit_op(s,'q');
      emit_op(s,'\x13');
      uVar9 = 0x47;
      val = 'G';
    }
    else {
      if (bVar1 != 0x4a) {
        if (bVar1 == 0xbc) {
          emit_op(s,0xbd);
          emit_atom(s,name);
          local_5c = uVar4;
          dbuf_put(&s->cur_func->byte_code,(uint8_t *)&local_5c,2);
          iVar5 = -1;
          uVar9 = 0xbc;
        }
        else {
          if (bVar1 != 0xb6) goto LAB_00156a2a;
          iVar5 = new_label_fd(fd,-1);
          emit_op(s,0xb9);
          emit_atom(s,name);
          local_38 = iVar5;
          dbuf_put(&s->cur_func->byte_code,(uint8_t *)&local_38,4);
          local_5e = uVar4;
          dbuf_put(&s->cur_func->byte_code,(uint8_t *)&local_5e,2);
          fd->label_slots[iVar5].ref_count = fd->label_slots[iVar5].ref_count + 1;
          uVar9 = 0x3c;
          emit_op(s,'<');
        }
        goto LAB_001569eb;
      }
      emit_op(s,'p');
      emit_op(s,'\x14');
      uVar9 = 0x4a;
      val = 'J';
    }
    emit_op(s,val);
    iVar5 = -1;
  }
LAB_001569eb:
  *local_58 = uVar9;
  *local_50 = uVar8;
  *local_48 = name;
  *local_40 = iVar5;
  if (pdepth != (int *)0x0) {
    *pdepth = iVar7;
  }
  return 0;
}

Assistant:

static __exception int get_lvalue(JSParseState *s, int *popcode, int *pscope,
                                  JSAtom *pname, int *plabel, int *pdepth, BOOL keep,
                                  int tok)
{
    JSFunctionDef *fd;
    int opcode, scope, label, depth;
    JSAtom name;

    /* we check the last opcode to get the lvalue type */
    fd = s->cur_func;
    scope = 0;
    name = JS_ATOM_NULL;
    label = -1;
    depth = 0;
    switch(opcode = get_prev_opcode(fd)) {
    case OP_scope_get_var:
        name = get_u32(fd->byte_code.buf + fd->last_opcode_pos + 1);
        scope = get_u16(fd->byte_code.buf + fd->last_opcode_pos + 5);
        if ((name == JS_ATOM_arguments || name == JS_ATOM_eval) &&
            (fd->js_mode & JS_MODE_STRICT)) {
            return js_parse_error(s, "invalid lvalue in strict mode");
        }
        if (name == JS_ATOM_this || name == JS_ATOM_new_target)
            goto invalid_lvalue;
        depth = 2;  /* will generate OP_get_ref_value */
        break;
    case OP_get_field:
        name = get_u32(fd->byte_code.buf + fd->last_opcode_pos + 1);
        depth = 1;
        break;
    case OP_scope_get_private_field:
        name = get_u32(fd->byte_code.buf + fd->last_opcode_pos + 1);
        scope = get_u16(fd->byte_code.buf + fd->last_opcode_pos + 5);
        depth = 1;
        break;
    case OP_get_array_el:
        depth = 2;
        break;
    case OP_get_super_value:
        depth = 3;
        break;
    default:
    invalid_lvalue:
        if (tok == TOK_FOR) {
            return js_parse_error(s, "invalid for in/of left hand-side");
        } else if (tok == TOK_INC || tok == TOK_DEC) {
            return js_parse_error(s, "invalid increment/decrement operand");
        } else if (tok == '[' || tok == '{') {
            return js_parse_error(s, "invalid destructuring target");
        } else {
            return js_parse_error(s, "invalid assignment left-hand side");
        }
    }
    /* remove the last opcode */
    fd->byte_code.size = fd->last_opcode_pos;
    fd->last_opcode_pos = -1;

    if (keep) {
        /* get the value but keep the object/fields on the stack */
        switch(opcode) {
        case OP_scope_get_var:
            label = new_label(s);
            emit_op(s, OP_scope_make_ref);
            emit_atom(s, name);
            emit_u32(s, label);
            emit_u16(s, scope);
            update_label(fd, label, 1);
            emit_op(s, OP_get_ref_value);
            opcode = OP_get_ref_value;
            break;
        case OP_get_field:
            emit_op(s, OP_get_field2);
            emit_atom(s, name);
            break;
        case OP_scope_get_private_field:
            emit_op(s, OP_scope_get_private_field2);
            emit_atom(s, name);
            emit_u16(s, scope);
            break;
        case OP_get_array_el:
            /* XXX: replace by a single opcode ? */
            emit_op(s, OP_to_propkey2);
            emit_op(s, OP_dup2);
            emit_op(s, OP_get_array_el);
            break;
        case OP_get_super_value:
            emit_op(s, OP_to_propkey);
            emit_op(s, OP_dup3);
            emit_op(s, OP_get_super_value);
            break;
        default:
            abort();
        }
    } else {
        switch(opcode) {
        case OP_scope_get_var:
            label = new_label(s);
            emit_op(s, OP_scope_make_ref);
            emit_atom(s, name);
            emit_u32(s, label);
            emit_u16(s, scope);
            update_label(fd, label, 1);
            opcode = OP_get_ref_value;
            break;
        case OP_get_array_el:
            emit_op(s, OP_to_propkey2);
            break;
        case OP_get_super_value:
            emit_op(s, OP_to_propkey);
            break;
        }
    }

    *popcode = opcode;
    *pscope = scope;
    /* name has refcount for OP_get_field and OP_get_ref_value,
       and JS_ATOM_NULL for other opcodes */
    *pname = name;
    *plabel = label;
    if (pdepth)
        *pdepth = depth;
    return 0;
}